

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O3

MTBDD mtbdd_enum_first(MTBDD dd,MTBDD variables,uint8_t *arr,mtbdd_enum_filter_cb filter_cb)

{
  uint8_t *puVar1;
  int iVar2;
  MTBDD MVar3;
  long lVar4;
  MTBDD MVar5;
  long lVar6;
  ulong uVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  
  if (dd == 0) {
    dd = 0;
  }
  else {
    uVar7 = variables;
    puVar9 = arr;
    if ((dd & 0x7fffffffffffffff) != 0) {
      lVar4 = (dd & 0xffffffffff) * 0x10;
      MVar5 = variables;
      puVar8 = arr;
      do {
        puVar1 = nodes->data;
        uVar7 = MVar5;
        puVar9 = puVar8;
        if ((puVar1[lVar4 + 7] & 0x40) != 0) break;
        if (MVar5 == 0x8000000000000000) {
          if (filter_cb == (mtbdd_enum_filter_cb)0x0) {
            return dd;
          }
          iVar2 = (*filter_cb)(dd);
          if (iVar2 != 0) {
            return dd;
          }
          goto LAB_0010b56f;
        }
        lVar6 = (MVar5 & 0xffffffffff) * 0x10;
        MVar5 = MVar5 & 0x8000000000000000 ^ *(ulong *)(puVar1 + lVar6) & 0x800000ffffffffff;
        if ((*(ulong *)(puVar1 + lVar6 + 8) ^ *(ulong *)(puVar1 + lVar4 + 8)) < 0x10000000000) {
          MVar3 = mtbdd_enum_first(*(ulong *)(puVar1 + lVar4 + 8) & 0xffffffffff |
                                   dd & 0x8000000000000000,MVar5,puVar8 + 1,filter_cb);
          if (MVar3 != 0) {
            *puVar8 = '\0';
            return MVar3;
          }
          MVar5 = mtbdd_enum_first(*(ulong *)(puVar1 + lVar4) & 0x800000ffffffffff ^
                                   dd & 0x8000000000000000,MVar5,puVar8 + 1,filter_cb);
          if (MVar5 != 0) {
            *puVar8 = '\x01';
            return MVar5;
          }
          goto LAB_0010b56f;
        }
        *puVar8 = '\x02';
        puVar8 = puVar8 + 1;
        uVar7 = variables;
        puVar9 = arr;
      } while ((dd & 0x7fffffffffffffff) != 0);
    }
    if ((filter_cb == (mtbdd_enum_filter_cb)0x0) || (iVar2 = (*filter_cb)(dd), iVar2 != 0)) {
      for (; uVar7 != 0x8000000000000000;
          uVar7 = uVar7 & 0x8000000000000000 ^
                  *(ulong *)(nodes->data + (uVar7 & 0xffffffffff) * 0x10) & 0x800000ffffffffff) {
        *puVar9 = '\x02';
        puVar9 = puVar9 + 1;
      }
    }
    else {
LAB_0010b56f:
      dd = 0;
    }
  }
  return dd;
}

Assistant:

MTBDD
mtbdd_enum_first(MTBDD dd, MTBDD variables, uint8_t *arr, mtbdd_enum_filter_cb filter_cb)
{
    if (dd == mtbdd_false) {
        // the leaf dd is skipped
        return mtbdd_false;
    } else if (mtbdd_isleaf(dd)) {
        // a leaf for which the filter returns 0 is skipped
        if (filter_cb != NULL && filter_cb(dd) == 0) return mtbdd_false;
        // ok, we have a leaf that is not skipped, go for it!
        while (variables != mtbdd_true) {
            *arr++ = 2;
            variables = mtbdd_gethigh(variables);
        }
        return dd;
    } else if (variables == mtbdd_true) {
        // in the case of partial evaluation... treat like a leaf
        if (filter_cb != NULL && filter_cb(dd) == 0) return mtbdd_false;
        return dd;
    } else {
        // if variables == true, then dd must be a leaf. But then this line is unreachable.
        // if this assertion fails, then <variables> is not the support of <dd>.
        assert(variables != mtbdd_true);

        // get next variable from <variables>
        uint32_t v = mtbdd_getvar(variables);
        variables = mtbdd_gethigh(variables);

        // check if MTBDD is on this variable
        mtbddnode_t n = MTBDD_GETNODE(dd);
        if (mtbddnode_getvariable(n) != v) {
            *arr = 2;
            return mtbdd_enum_first(dd, variables, arr+1, filter_cb);
        }

        // first maybe follow low
        MTBDD res = mtbdd_enum_first(node_getlow(dd, n), variables, arr+1, filter_cb);
        if (res != mtbdd_false) {
            *arr = 0;
            return res;
        }

        // if not low, try following high
        res = mtbdd_enum_first(node_gethigh(dd, n), variables, arr+1, filter_cb);
        if (res != mtbdd_false) {
            *arr = 1;
            return res;
        }
        
        // we've tried low and high, return false
        return mtbdd_false;
    }
}